

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int readDisplacement(InternalInstruction *insn)

{
  int iVar1;
  int32_t *ptr;
  long in_RDI;
  int32_t d32;
  int16_t d16;
  int8_t d8;
  int in_stack_ffffffffffffffe8;
  short in_stack_ffffffffffffffec;
  undefined1 in_stack_ffffffffffffffee;
  char in_stack_ffffffffffffffef;
  
  if ((*(byte *)(in_RDI + 0x74) & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x74) = 1;
    *(char *)(in_RDI + 0x96) =
         (char)*(undefined4 *)(in_RDI + 0xb0) - (char)*(undefined4 *)(in_RDI + 0xd0);
    ptr = (int32_t *)(ulong)*(uint *)(in_RDI + 0x13c);
    switch(ptr) {
    case (int32_t *)0x0:
      *(undefined1 *)(in_RDI + 0x74) = 0;
      break;
    case (int32_t *)0x1:
      iVar1 = consumeInt8((InternalInstruction *)
                          CONCAT17(in_stack_ffffffffffffffef,
                                   CONCAT16(in_stack_ffffffffffffffee,
                                            CONCAT24(in_stack_ffffffffffffffec,
                                                     in_stack_ffffffffffffffe8))),(int8_t *)ptr);
      if (iVar1 != 0) {
        return -1;
      }
      *(long *)(in_RDI + 0x78) = (long)in_stack_ffffffffffffffef;
      break;
    case (int32_t *)0x2:
      iVar1 = consumeInt16((InternalInstruction *)
                           CONCAT17(in_stack_ffffffffffffffef,
                                    CONCAT16(in_stack_ffffffffffffffee,
                                             CONCAT24(in_stack_ffffffffffffffec,
                                                      in_stack_ffffffffffffffe8))),(int16_t *)ptr);
      if (iVar1 != 0) {
        return -1;
      }
      *(long *)(in_RDI + 0x78) = (long)in_stack_ffffffffffffffec;
      break;
    case (int32_t *)0x3:
      iVar1 = consumeInt32((InternalInstruction *)
                           CONCAT17(in_stack_ffffffffffffffef,
                                    CONCAT16(in_stack_ffffffffffffffee,
                                             CONCAT24(in_stack_ffffffffffffffec,
                                                      in_stack_ffffffffffffffe8))),ptr);
      if (iVar1 != 0) {
        return -1;
      }
      *(long *)(in_RDI + 0x78) = (long)in_stack_ffffffffffffffe8;
    }
  }
  return 0;
}

Assistant:

static int readDisplacement(struct InternalInstruction *insn)
{
	int8_t d8;
	int16_t d16;
	int32_t d32;

	// dbgprintf(insn, "readDisplacement()");

	if (insn->consumedDisplacement)
		return 0;

	insn->consumedDisplacement = true;
	insn->displacementOffset = (uint8_t)(insn->readerCursor - insn->startLocation);

	switch (insn->eaDisplacement) {
		case EA_DISP_NONE:
			insn->consumedDisplacement = false;
			break;
		case EA_DISP_8:
			if (consumeInt8(insn, &d8))
				return -1;
			insn->displacement = d8;
			break;
		case EA_DISP_16:
			if (consumeInt16(insn, &d16))
				return -1;
			insn->displacement = d16;
			break;
		case EA_DISP_32:
			if (consumeInt32(insn, &d32))
				return -1;
			insn->displacement = d32;
			break;
	}

	return 0;
}